

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_12d80::AckermannTask::provideValue
          (AckermannTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,ValueType *value)

{
  int iVar1;
  int n;
  AckermannValue local_6c;
  AckermannKey local_68;
  KeyType local_60;
  AckermannValue local_3c;
  ValueType *local_38;
  ValueType *value_local;
  KeyType *key_local;
  uintptr_t inputID_local;
  AckermannTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (AckermannTask *)ti.impl;
  local_38 = value;
  value_local = (ValueType *)key;
  key_local = (KeyType *)inputID;
  inputID_local = (uintptr_t)this;
  if (inputID == 0) {
    AckermannValue::AckermannValue(&local_3c,value);
    (this->recursiveResultA).value = local_3c.value;
    if ((this->m != 0) && (this->n != 0)) {
      iVar1 = this->m;
      n = (anonymous_namespace)::AckermannValue::operator_cast_to_int
                    ((AckermannValue *)&this->recursiveResultA);
      AckermannKey::AckermannKey(&local_68,iVar1 + -1,n);
      (anonymous_namespace)::AckermannKey::operator_cast_to_KeyType
                (&local_60,(AckermannKey *)&local_68);
      llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_60,1);
      llbuild::core::KeyType::~KeyType(&local_60);
    }
  }
  else {
    if (inputID != 1) {
      __assert_fail("inputID == 1 && \"invalid input ID\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/BuildEngineCommand.cpp"
                    ,0xa8,
                    "virtual void (anonymous namespace)::AckermannTask::provideValue(core::TaskInterface, uintptr_t, const core::KeyType &, const core::ValueType &)"
                   );
    }
    AckermannValue::AckermannValue(&local_6c,value);
    (this->recursiveResultB).value = local_6c.value;
  }
  return;
}

Assistant:

virtual void provideValue(core::TaskInterface ti, uintptr_t inputID,
                            const core::KeyType& key, const core::ValueType& value) override {
    if (inputID == 0) {
      recursiveResultA = value;

      // Request the second recursive result, if needed.
      if (m != 0 && n != 0) {
        ti.request(AckermannKey(m-1, recursiveResultA), 1);
      }
    } else {
      assert(inputID == 1 && "invalid input ID");
      recursiveResultB = value;
    }
  }